

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netpong.cpp
# Opt level: O0

void start_game(void)

{
  int iVar1;
  uint uVar2;
  Am_Value *pAVar3;
  ulong uVar4;
  Am_Object local_30;
  undefined4 local_28;
  Am_Object local_18;
  Am_Object local_10;
  
  pAVar3 = (Am_Value *)Am_Object::Get(0xb2d8,0x66);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set(0xb2f8,100,(long)(iVar1 + -0x15) / 2 & 0xffffffff);
  pAVar3 = (Am_Value *)Am_Object::Get(0xb2e0,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set(0xb2f8,0x65,(long)(iVar1 + -0x15) / 2 & 0xffffffff);
  Am_Object::Set(0xb2f8,true,1);
  pAVar3 = (Am_Value *)Am_Object::Get(0xb2e0,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set(0xb2e8,0x65,(long)(iVar1 + -0x3c) / 2 & 0xffffffff);
  pAVar3 = (Am_Value *)Am_Object::Get(0xb2e0,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Set(0xb2f0,0x65,(long)(iVar1 + -0x3c) / 2 & 0xffffffff);
  uVar2 = rand();
  y_offset = (uVar2 & 7) + 1;
  uVar2 = rand();
  if ((uVar2 & 1) != 0) {
    y_offset = -y_offset;
  }
  uVar2 = rand();
  x_offset = (uVar2 & 7) + 1;
  if ((player1sturn & 1U) != 0) {
    x_offset = -x_offset;
  }
  uVar4 = Am_Network_Group::Am_Leader();
  if ((uVar4 & 1) != 0) {
    Am_Object::Am_Object(&local_10,(Am_Object *)&anim);
    Am_Object::Am_Object(&local_18,(Am_Object *)&Am_No_Object);
    local_28 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_30,(Am_Object *)&Am_No_Object);
    Am_Start_Interactor(&local_10,&local_18,local_28,&local_30,0,0,1);
    Am_Object::~Am_Object(&local_30);
    Am_Object::~Am_Object(&local_18);
    Am_Object::~Am_Object(&local_10);
  }
  return;
}

Assistant:

void
start_game(void)
{
  ball.Set(Am_LEFT, (int)((int)window.Get(Am_WIDTH) - ball_size) / 2);
  ball.Set(Am_TOP, (int)((int)main_group.Get(Am_HEIGHT) - ball_size) / 2);
  ball.Set(Am_VISIBLE, true);
  paddle1.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  paddle2.Set(Am_TOP,
              (int)((int)main_group.Get(Am_HEIGHT) - paddle_height) / 2);
  y_offset = (rand() & 7) + 1;
  if (rand() & 1)
    y_offset = -y_offset;
  x_offset = (rand() & 7) + 1;
  if (player1sturn)
    x_offset = -x_offset;
  if (Am_Network.Am_Leader())
    Am_Start_Interactor(anim);
}